

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

size_t __thiscall Attribute::SetDataSize(Attribute *this)

{
  size_t sVar1;
  long lVar2;
  pointer pAVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  pAVar3 = (this->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
      super__Vector_impl_data._M_finish == pAVar3) {
    uVar5 = 0;
  }
  else {
    lVar6 = 0;
    uVar4 = 0;
    uVar5 = 0;
    do {
      sVar1 = AnyType::EncodedSize
                        ((AnyType *)((long)&(pAVar3->super_DerBase)._vptr_DerBase + lVar6));
      uVar5 = uVar5 + sVar1;
      uVar4 = uVar4 + 1;
      pAVar3 = (this->attrValues).super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x28;
    } while (uVar4 < (ulong)(((long)(this->attrValues).
                                    super__Vector_base<AnyType,_std::allocator<AnyType>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pAVar3 >> 3) *
                            -0x3333333333333333));
  }
  lVar2 = 2;
  lVar6 = 2;
  if ((((0x7f < uVar5) && (lVar6 = 3, 0xff < uVar5)) && (lVar6 = 4, 0xffff < uVar5)) &&
     (((lVar6 = 5, 0xffffff < uVar5 && (lVar6 = 6, uVar5 >> 0x20 != 0)) &&
      (lVar6 = 7, uVar5 >> 0x28 != 0)))) {
    lVar6 = (ulong)(uVar5 >> 0x30 == 0) << 3;
  }
  uVar4 = (this->attrType).super_DerBase.cbData;
  if (((0x7f < uVar4) && (lVar2 = 3, 0xff < uVar4)) &&
     ((lVar2 = 4, 0xffff < uVar4 &&
      (((lVar2 = 5, 0xffffff < uVar4 && (lVar2 = 6, uVar4 >> 0x20 != 0)) &&
       (lVar2 = 7, uVar4 >> 0x28 != 0)))))) {
    lVar2 = (ulong)(uVar4 >> 0x30 == 0) << 3;
  }
  sVar1 = lVar6 + uVar5 + lVar2 + uVar4;
  (this->super_DerBase).cbData = sVar1;
  return sVar1;
}

Assistant:

virtual size_t SetDataSize() override
	{
		size_t cbNeeded = 0; // For the set byte

		// First, calculate how much is needed for the set of attrValues
		for (size_t i = 0; i < attrValues.size(); ++i)
		{
			cbNeeded += attrValues[i].EncodedSize();
		}

		cbNeeded += GetSizeBytes(cbNeeded) + 1;
		// And next, the sequence 
		cbNeeded += attrType.EncodedSize();
		return (cbData = cbNeeded);
	}